

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsParser.cxx
# Opt level: O3

int __thiscall kws::Parser::IsInClass(Parser *this,size_t position)

{
  ulong uVar1;
  size_t sVar2;
  size_t sVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  string local_90;
  string local_70;
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50);
  sVar2 = GetClassPosition(this,0,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if (sVar2 == 0xffffffffffffffff) {
    iVar4 = 0;
  }
  else {
    iVar4 = 0;
    do {
      uVar1 = (this->m_BufferNoComment)._M_string_length;
      uVar6 = sVar2;
      if (sVar2 < uVar1) {
        uVar5 = sVar2;
        do {
          uVar6 = uVar5;
          if ((this->m_BufferNoComment)._M_dataplus._M_p[uVar5] == '{') break;
          uVar5 = uVar5 + 1;
          uVar6 = uVar1;
        } while (uVar1 != uVar5);
      }
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"");
      sVar3 = FindClosingChar(this,'{','}',uVar6 + 1,true,&local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      bVar7 = sVar2 < position;
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
      sVar2 = GetClassPosition(this,sVar2 + 1,&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      iVar4 = iVar4 + (uint)(bVar7 && position < sVar3);
    } while (sVar2 != 0xffffffffffffffff);
  }
  return iVar4;
}

Assistant:

int Parser::IsInClass(size_t position) const
{
  int inClass = 0;
  size_t classPos = this->GetClassPosition(0);
  while(classPos!=std::string::npos)
    {
    size_t i=classPos;
    while(i!=std::string::npos && i<m_BufferNoComment.size())
      {
      if(m_BufferNoComment[i] == '{')
        {
        break;
        }
      i++;
      }
    size_t classEnd = this->FindClosingChar('{','}',i+1,true);

    if(position>classPos && position<classEnd)
      {
      inClass++;
      }
    classPos = this->GetClassPosition(classPos+1);
    }

  return inClass;
}